

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::FormatMatcherDescription
                   (bool negation,char *matcher_name,Strings *param_values)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  byte in_SIL;
  string *in_RDI;
  string result;
  string *__rhs;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar2;
  string local_b0 [40];
  Strings *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_60 [32];
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  byte local_9;
  
  local_9 = in_SIL & 1;
  __rhs = in_RDI;
  local_20 = in_RCX;
  ConvertIdentifierNameToWords_abi_cxx11_((char *)in_stack_ffffffffffffff78);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (sVar1 != 0) {
    JoinAsTuple(in_stack_ffffffffffffff78);
    std::operator+((char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),__rhs);
    std::__cxx11::string::operator+=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  bVar2 = 0;
  if ((local_9 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,local_40);
  }
  else {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    bVar2 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(1,in_stack_ffffffffffffff48),(char *)__rhs);
  }
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  std::__cxx11::string::~string(local_40);
  return __rhs;
}

Assistant:

GTEST_API_ string FormatMatcherDescription(bool negation,
                                           const char* matcher_name,
                                           const Strings& param_values) {
  string result = ConvertIdentifierNameToWords(matcher_name);
  if (param_values.size() >= 1)
    result += " " + JoinAsTuple(param_values);
  return negation ? "not (" + result + ")" : result;
}